

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_data_freer(png_const_structrp png_ptr,png_inforp info_ptr,int freer,png_uint_32 mask)

{
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    if (freer != 2) {
      if (freer == 1) {
        info_ptr->free_me = info_ptr->free_me | mask;
        return;
      }
      png_error(png_ptr,"Unknown freer parameter in png_data_freer");
    }
    info_ptr->free_me = info_ptr->free_me & ~mask;
  }
  return;
}

Assistant:

void PNGAPI
png_data_freer(png_const_structrp png_ptr, png_inforp info_ptr,
    int freer, png_uint_32 mask)
{
   png_debug(1, "in png_data_freer");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (freer == PNG_DESTROY_WILL_FREE_DATA)
      info_ptr->free_me |= mask;

   else if (freer == PNG_USER_WILL_FREE_DATA)
      info_ptr->free_me &= ~mask;

   else
      png_error(png_ptr, "Unknown freer parameter in png_data_freer");
}